

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

double __thiscall
gl4cts::EnhancedLayouts::Utils::Shader::InvalidSourceException::log
          (InvalidSourceException *this,double __x)

{
  char *__s;
  size_t sVar1;
  Context *in_RSI;
  double extraout_XMM0_Qa;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  local_1a0 = (undefined1  [8])in_RSI->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Failed to compile shader: ",0x1a);
  __s = (this->m_message)._M_dataplus._M_p;
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,__s,sVar1);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  LogSource(in_RSI,&this->m_source,this->m_stage);
  return extraout_XMM0_Qa;
}

Assistant:

void Shader::InvalidSourceException::log(deqp::Context& context) const
{
	context.getTestContext().getLog() << tcu::TestLog::Message << "Failed to compile shader: " << m_message.c_str()
									  << tcu::TestLog::EndMessage;

	LogSource(context, m_source, m_stage);
}